

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

CProgramPtr __thiscall
CSourceFilesProcessor::Compile(CSourceFilesProcessor *this,CFileNames *fileNames)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CProgramPtr CVar1;
  CSourceFilesProcessor sourceFilesProcessor;
  CSourceFilesProcessor local_21b8;
  
  CSourceFilesProcessor(&local_21b8,fileNames);
  Refal2::CProgramBuilder::BuildProgram((CProgramBuilder *)this);
  local_21b8.super_IErrorHandler._vptr_IErrorHandler = (_func_int **)&PTR_Error_00148cd0;
  std::ifstream::~ifstream(&local_21b8.file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_21b8.scanner.super_CParser.savedToken2.word._M_dataplus._M_p !=
      &local_21b8.scanner.super_CParser.savedToken2.word.field_2) {
    operator_delete(local_21b8.scanner.super_CParser.savedToken2.word._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_21b8.scanner.super_CParser.savedToken1.word._M_dataplus._M_p !=
      &local_21b8.scanner.super_CParser.savedToken1.word.field_2) {
    operator_delete(local_21b8.scanner.super_CParser.savedToken1.word._M_dataplus._M_p);
  }
  Refal2::CDirectiveParser::~CDirectiveParser((CDirectiveParser *)&local_21b8.scanner);
  CVar1.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CProgramPtr)CVar1.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CProgramPtr CSourceFilesProcessor::Compile( const CFileNames& fileNames )
{
	CSourceFilesProcessor sourceFilesProcessor( fileNames );
	return sourceFilesProcessor.scanner.BuildProgram();
}